

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O3

void __thiscall
Assimp::X3DExporter::AttrHelper_Vec3DAsVec2fArrToString
          (X3DExporter *this,aiVector3D *pArray,size_t pArray_Size,string *pTargetString)

{
  undefined8 *puVar1;
  size_type sVar2;
  pointer pcVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  long *plVar7;
  size_type sVar8;
  string *__range2;
  ulong uVar9;
  undefined8 uVar10;
  float *pfVar11;
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTargetString->_M_string_length = 0;
  *(pTargetString->_M_dataplus)._M_p = '\0';
  std::__cxx11::string::reserve((ulong)pTargetString);
  if (pArray_Size != 0) {
    pfVar11 = &pArray->y;
    do {
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_50,vsnprintf,0x3a,"%f",SUB84((double)((aiVector3D *)(pfVar11 + -1))->x,0));
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
      puVar6 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar6) {
        local_a0 = *puVar6;
        lStack_98 = plVar4[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *puVar6;
        local_b0 = (ulong *)*plVar4;
      }
      local_a8 = plVar4[1];
      *plVar4 = (long)puVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_70,vsnprintf,0x3a,"%f",SUB84((double)*pfVar11,0));
      uVar9 = 0xf;
      if (local_b0 != &local_a0) {
        uVar9 = local_a0;
      }
      if (uVar9 < local_70._M_string_length + local_a8) {
        uVar10 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          uVar10 = local_70.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar10 < local_70._M_string_length + local_a8) goto LAB_00343af1;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_b0);
      }
      else {
LAB_00343af1:
        puVar5 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_70._M_dataplus._M_p)
        ;
      }
      puVar1 = puVar5 + 2;
      if ((undefined8 *)*puVar5 == puVar1) {
        local_c0 = *puVar1;
        uStack_b8 = puVar5[3];
        local_d0 = &local_c0;
      }
      else {
        local_c0 = *puVar1;
        local_d0 = (undefined8 *)*puVar5;
      }
      local_c8 = puVar5[1];
      *puVar5 = puVar1;
      puVar5[1] = 0;
      *(undefined1 *)puVar1 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
      local_90 = &local_80;
      plVar7 = plVar4 + 2;
      if ((long *)*plVar4 == plVar7) {
        local_80 = *plVar7;
        lStack_78 = plVar4[3];
      }
      else {
        local_80 = *plVar7;
        local_90 = (long *)*plVar4;
      }
      local_88 = plVar4[1];
      *plVar4 = (long)plVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::_M_append((char *)pTargetString,(ulong)local_90);
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_d0 != &local_c0) {
        operator_delete(local_d0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (local_b0 != &local_a0) {
        operator_delete(local_b0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      pfVar11 = pfVar11 + 3;
      pArray_Size = pArray_Size - 1;
    } while (pArray_Size != 0);
  }
  std::__cxx11::string::resize((ulong)pTargetString,(char)pTargetString->_M_string_length + -1);
  sVar2 = pTargetString->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (pTargetString->_M_dataplus)._M_p;
    sVar8 = 0;
    do {
      if (pcVar3[sVar8] == ',') {
        pcVar3[sVar8] = '.';
      }
      sVar8 = sVar8 + 1;
    } while (sVar2 != sVar8);
  }
  return;
}

Assistant:

void X3DExporter::AttrHelper_Vec3DAsVec2fArrToString(const aiVector3D* pArray, const size_t pArray_Size, string& pTargetString)
{
	pTargetString.clear();
	pTargetString.reserve(pArray_Size * 4);// (Number + space) * 2.
	for(size_t idx = 0; idx < pArray_Size; idx++)
		pTargetString.append(to_string(pArray[idx].x) + " " + to_string(pArray[idx].y) + " ");

	// remove last space symbol.
	pTargetString.resize(pTargetString.length() - 1);
	AttrHelper_CommaToPoint(pTargetString);
}